

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  iterator __position;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  int number;
  vector<int,_std::allocator<int>_> primes;
  string line;
  ifstream stream;
  uint local_25c;
  void *local_258;
  int *piStack_250;
  int *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230 [16];
  long local_220 [65];
  
  std::ifstream::ifstream((istream *)local_220,argv[1],_S_in);
  local_238 = 0;
  local_230[0] = 0;
  local_248 = (int *)0x0;
  local_258 = (void *)0x0;
  piStack_250 = (int *)0x0;
  local_25c = 2;
  local_240 = local_230;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_220[0] + -0x18) + (char)(istream *)local_220
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,(string *)&local_240,cVar1);
  } while (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0);
  uVar3 = 2;
  pvVar5 = (void *)0x0;
  __position._M_current = (int *)0x0;
  do {
    if (2 < (int)uVar3) {
      uVar7 = 2;
      do {
        if ((int)((ulong)uVar3 % uVar7) == 0) goto LAB_00101351;
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while (uVar3 != uVar6);
    }
    if (__position._M_current == local_248) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_258,__position,(int *)&local_25c);
      __position._M_current = piStack_250;
      pvVar5 = local_258;
    }
    else {
      *__position._M_current = uVar3;
      piStack_250 = __position._M_current + 1;
      __position._M_current = piStack_250;
    }
LAB_00101351:
    uVar3 = local_25c + 1;
    uVar7 = (long)__position._M_current - (long)pvVar5 >> 2;
    local_25c = uVar3;
    if (999 < uVar7) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
      std::ostream::_M_insert<long>((long)&std::cout);
      if (local_258 != (void *)0x0) {
        operator_delete(local_258);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      std::ifstream::~ifstream(local_220);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
    string line;

    std::vector<int> primes;
    int number = 2;
    while (getline(stream, line)) {
    }

    while (primes.size() < 1000) {
        if (isPrime(number)) {
            primes.push_back(number);
        }
        number++;
    }

    long int sum = 0;
    for (int i = 0; i < primes.size(); i++) {
        sum += primes[i];
    }

    std::cout << sum;
    return 0;
}